

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

fdb_status fdb_get_kvs_name_list(fdb_file_handle *fhandle,fdb_kvs_name_list *kvs_name_list)

{
  char **ppcVar1;
  kvs_header *pkVar2;
  fdb_status fVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  size_t sVar6;
  char **ppcVar7;
  long lVar8;
  size_t sVar9;
  
  if (fhandle == (fdb_file_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (kvs_name_list == (fdb_kvs_name_list *)0x0) {
    fVar3 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    pkVar2 = fhandle->root->file->kv_header;
    pthread_spin_lock(&pkVar2->lock);
    paVar4 = avl_first(pkVar2->idx_id);
    if (paVar4 == (avl_node *)0x0) {
      sVar9 = 1;
      lVar8 = 8;
    }
    else {
      lVar8 = 8;
      sVar9 = 1;
      do {
        paVar5 = avl_next(paVar4);
        sVar9 = sVar9 + 1;
        sVar6 = strlen((char *)paVar4[-8].left);
        lVar8 = lVar8 + sVar6 + 1;
        paVar4 = paVar5;
      } while (paVar5 != (avl_node *)0x0);
    }
    ppcVar7 = (char **)calloc(1,lVar8 + sVar9 * 8);
    kvs_name_list->num_kvs_names = sVar9;
    kvs_name_list->kvs_names = ppcVar7;
    ppcVar1 = ppcVar7 + sVar9;
    *ppcVar1 = (char *)0x746c7561666564;
    *ppcVar7 = (char *)ppcVar1;
    paVar4 = avl_first(pkVar2->idx_name);
    if (paVar4 != (avl_node *)0x0) {
      lVar8 = 8;
      do {
        ppcVar7 = ppcVar7 + 1;
        paVar5 = avl_next(paVar4);
        strcpy((char *)(lVar8 + (long)ppcVar1),(char *)paVar4[-7].left);
        *ppcVar7 = (char *)(lVar8 + (long)ppcVar1);
        sVar6 = strlen((char *)paVar4[-7].left);
        lVar8 = lVar8 + sVar6 + 1;
        paVar4 = paVar5;
      } while (paVar5 != (avl_node *)0x0);
    }
    pthread_spin_unlock(&pkVar2->lock);
    fVar3 = FDB_RESULT_SUCCESS;
  }
  return fVar3;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_name_list(fdb_file_handle *fhandle,
                                 fdb_kvs_name_list *kvs_name_list)
{
    size_t num, size, offset;
    char *ptr;
    char **segment;
    fdb_kvs_handle *root_handle;
    struct kvs_header *kv_header;
    struct kvs_node *node;
    struct avl_node *a;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!kvs_name_list) {
        return FDB_RESULT_INVALID_ARGS;
    }

    root_handle = fhandle->root;
    kv_header = root_handle->file->kv_header;

    spin_lock(&kv_header->lock);
    // sum all lengths of KVS names first
    // (to calculate the size of memory segment to be allocated)
    num = 1;
    size = strlen(default_kvs_name) + 1;
    a = avl_first(kv_header->idx_id);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_id);
        a = avl_next(&node->avl_id);

        num++;
        size += strlen(node->kvs_name) + 1;
    }
    size += num * sizeof(char*);

    // allocate memory segment
    segment = (char**)calloc(1, size);
    kvs_name_list->num_kvs_names = num;
    kvs_name_list->kvs_names = segment;

    ptr = (char*)segment + num * sizeof(char*);
    offset = num = 0;

    // copy default KVS name
    strcpy(ptr + offset, default_kvs_name);
    segment[num] = ptr + offset;
    num++;
    offset += strlen(default_kvs_name) + 1;

    // copy the others
    a = avl_first(kv_header->idx_name);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(&node->avl_name);

        strcpy(ptr + offset, node->kvs_name);
        segment[num] = ptr + offset;

        num++;
        offset += strlen(node->kvs_name) + 1;
    }

    spin_unlock(&kv_header->lock);

    return FDB_RESULT_SUCCESS;
}